

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

void cos_setup(void)

{
  _class *c;
  t_symbol *ptVar1;
  
  ptVar1 = gensym("cos~");
  cos_class = class_new(ptVar1,cos_new,(t_method)0x0,0x38,0,A_DEFFLOAT,0);
  class_setfreefn(cos_class,cos_cleanup);
  class_domainsignalin(cos_class,0x30);
  c = cos_class;
  ptVar1 = gensym("dsp");
  class_addmethod(c,cos_dsp,ptVar1,A_CANT,0);
  cos_maketable();
  return;
}

Assistant:

static void cos_setup(void)
{
    cos_class = class_new(gensym("cos~"), (t_newmethod)cos_new, 0,
        sizeof(t_cos), 0, A_DEFFLOAT, 0);
    class_setfreefn(cos_class, cos_cleanup);
    CLASS_MAINSIGNALIN(cos_class, t_cos, x_f);
    class_addmethod(cos_class, (t_method)cos_dsp, gensym("dsp"), A_CANT, 0);
    cos_maketable();
}